

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ssize_t ossl_send(Curl_easy *data,int sockindex,void *mem,size_t len,CURLcode *curlcode)

{
  uint err_00;
  connectdata *pcVar1;
  ssl_backend_data *psVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  uint *puVar6;
  int local_1fc;
  char local_1f8 [8];
  char ver [120];
  int sockerr;
  ssl_backend_data *backend;
  ssl_connect_data *connssl;
  connectdata *conn;
  int rc;
  int memlen;
  unsigned_long sslerror;
  char error_buffer [256];
  int err;
  CURLcode *curlcode_local;
  size_t len_local;
  void *mem_local;
  int sockindex_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  psVar2 = pcVar1->ssl[sockindex].backend;
  ERR_clear_error();
  if (len < 0x80000000) {
    local_1fc = (int)len;
  }
  else {
    local_1fc = 0x7fffffff;
  }
  (pcVar1->ssl[0].backend)->logger = data;
  iVar3 = SSL_write((SSL *)psVar2->handle,mem,local_1fc);
  if (iVar3 < 1) {
    iVar3 = SSL_get_error((SSL *)psVar2->handle,iVar3);
    if (iVar3 == 1) {
      uVar4 = ERR_get_error();
      iVar3 = ERR_GET_LIB(uVar4);
      if ((((iVar3 == 0x14) && (iVar3 = ERR_GET_REASON(uVar4), iVar3 == 0x80)) &&
          (pcVar1->ssl[sockindex].state == ssl_connection_complete)) &&
         (pcVar1->proxy_ssl[sockindex].state == ssl_connection_complete)) {
        ossl_version(local_1f8,0x78);
        Curl_failf(data,"Error: %s does not support double SSL tunneling.",local_1f8);
      }
      else {
        pcVar5 = ossl_strerror(uVar4,(char *)&sslerror,0x100);
        Curl_failf(data,"SSL_write() error: %s",pcVar5);
      }
      *curlcode = CURLE_SEND_ERROR;
      data_local = (Curl_easy *)0xffffffffffffffff;
    }
    else if (iVar3 - 2U < 2) {
      *curlcode = CURLE_AGAIN;
      data_local = (Curl_easy *)0xffffffffffffffff;
    }
    else if (iVar3 == 5) {
      puVar6 = (uint *)__errno_location();
      err_00 = *puVar6;
      uVar4 = ERR_get_error();
      if (uVar4 == 0) {
        if (err_00 == 0) {
          pcVar5 = SSL_ERROR_to_str(5);
          strncpy((char *)&sslerror,pcVar5,0x100);
          error_buffer[0xf7] = '\0';
        }
        else {
          Curl_strerror(err_00,(char *)&sslerror,0x100);
        }
      }
      else {
        ossl_strerror(uVar4,(char *)&sslerror,0x100);
      }
      Curl_failf(data,"OpenSSL SSL_write: %s, errno %d",&sslerror,(ulong)err_00);
      *curlcode = CURLE_SEND_ERROR;
      data_local = (Curl_easy *)0xffffffffffffffff;
    }
    else {
      pcVar5 = SSL_ERROR_to_str(iVar3);
      puVar6 = (uint *)__errno_location();
      Curl_failf(data,"OpenSSL SSL_write: %s, errno %d",pcVar5,(ulong)*puVar6);
      *curlcode = CURLE_SEND_ERROR;
      data_local = (Curl_easy *)0xffffffffffffffff;
    }
  }
  else {
    *curlcode = CURLE_OK;
    data_local = (Curl_easy *)(long)iVar3;
  }
  return (ssize_t)data_local;
}

Assistant:

static ssize_t ossl_send(struct Curl_easy *data,
                         int sockindex,
                         const void *mem,
                         size_t len,
                         CURLcode *curlcode)
{
  /* SSL_write() is said to return 'int' while write() and send() returns
     'size_t' */
  int err;
  char error_buffer[256];
  unsigned long sslerror;
  int memlen;
  int rc;
  struct connectdata *conn = data->conn;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  struct ssl_backend_data *backend = connssl->backend;

  DEBUGASSERT(backend);

  ERR_clear_error();

  memlen = (len > (size_t)INT_MAX) ? INT_MAX : (int)len;
  set_logger(conn, data);
  rc = SSL_write(backend->handle, mem, memlen);

  if(rc <= 0) {
    err = SSL_get_error(backend->handle, rc);

    switch(err) {
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* The operation did not complete; the same TLS/SSL I/O function
         should be called again later. This is basically an EWOULDBLOCK
         equivalent. */
      *curlcode = CURLE_AGAIN;
      return -1;
    case SSL_ERROR_SYSCALL:
      {
        int sockerr = SOCKERRNO;
        sslerror = ERR_get_error();
        if(sslerror)
          ossl_strerror(sslerror, error_buffer, sizeof(error_buffer));
        else if(sockerr)
          Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
        else {
          strncpy(error_buffer, SSL_ERROR_to_str(err), sizeof(error_buffer));
          error_buffer[sizeof(error_buffer) - 1] = '\0';
        }
        failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
              error_buffer, sockerr);
        *curlcode = CURLE_SEND_ERROR;
        return -1;
      }
    case SSL_ERROR_SSL:
      /*  A failure in the SSL library occurred, usually a protocol error.
          The OpenSSL error queue contains more information on the error. */
      sslerror = ERR_get_error();
      if(ERR_GET_LIB(sslerror) == ERR_LIB_SSL &&
         ERR_GET_REASON(sslerror) == SSL_R_BIO_NOT_SET &&
         conn->ssl[sockindex].state == ssl_connection_complete
#ifndef CURL_DISABLE_PROXY
         && conn->proxy_ssl[sockindex].state == ssl_connection_complete
#endif
        ) {
        char ver[120];
        (void)ossl_version(ver, sizeof(ver));
        failf(data, "Error: %s does not support double SSL tunneling.", ver);
      }
      else
        failf(data, "SSL_write() error: %s",
              ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)));
      *curlcode = CURLE_SEND_ERROR;
      return -1;
    }
    /* a true error */
    failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
          SSL_ERROR_to_str(err), SOCKERRNO);
    *curlcode = CURLE_SEND_ERROR;
    return -1;
  }
  *curlcode = CURLE_OK;
  return (ssize_t)rc; /* number of bytes */
}